

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O1

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::sort
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,size_t blockSize)

{
  uint *__last;
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  uint *__i;
  uint *puVar10;
  value_type_conflict2 __val_2;
  size_t numTasks;
  size_t __n;
  uint *puVar11;
  value_type_conflict2 __val;
  
  uVar7 = this->N;
  if (blockSize < uVar7) {
    uVar6 = ((blockSize + uVar7) - 1) / blockSize;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar7 = (long)iVar5;
    if (uVar6 < (ulong)(long)iVar5) {
      uVar7 = uVar6;
    }
    numTasks = 0x40;
    if (uVar7 < 0x40) {
      numTasks = uVar7;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  if (uVar7 != 0) {
    puVar10 = this->src;
    __last = puVar10 + uVar7;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_int_const&,unsigned_int_const&)>>
              (puVar10,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_unsigned_int_&,_const_unsigned_int_&)>)0xe2264e);
    if ((long)uVar7 < 0x11) {
      if (uVar7 != 1) {
        puVar9 = puVar10 + 1;
        puVar11 = puVar10;
        do {
          puVar8 = puVar9;
          uVar1 = puVar11[1];
          if (uVar1 < *puVar10) {
            memmove((void *)((long)puVar11 + (8 - ((long)puVar8 - (long)puVar10))),puVar10,
                    (long)puVar8 - (long)puVar10);
            puVar9 = puVar10;
          }
          else {
            uVar2 = *puVar11;
            puVar9 = puVar8;
            while (uVar1 < uVar2) {
              *puVar9 = puVar9[-1];
              uVar2 = puVar9[-2];
              puVar9 = puVar9 + -1;
            }
          }
          *puVar9 = uVar1;
          puVar9 = puVar8 + 1;
          puVar11 = puVar8;
        } while (puVar8 + 1 != __last);
      }
    }
    else {
      __n = 4;
      puVar9 = puVar10;
      puVar11 = puVar10 + 1;
      do {
        puVar8 = (uint *)((long)puVar10 + __n);
        uVar1 = *(uint *)((long)puVar10 + __n);
        if (uVar1 < *puVar10) {
          memmove(puVar10 + 1,puVar10,__n);
          puVar9 = puVar10;
        }
        else {
          uVar2 = *puVar9;
          puVar9 = puVar8;
          puVar4 = puVar11;
          while (uVar1 < uVar2) {
            puVar9 = puVar4 + -1;
            *puVar4 = puVar4[-1];
            uVar2 = puVar4[-2];
            puVar4 = puVar9;
          }
        }
        *puVar9 = uVar1;
        __n = __n + 4;
        puVar11 = puVar11 + 1;
        puVar9 = puVar8;
      } while (__n != 0x40);
      puVar10 = puVar10 + 0x10;
      do {
        uVar2 = *puVar10;
        uVar1 = puVar10[-1];
        puVar9 = puVar10;
        while (uVar2 < uVar1) {
          *puVar9 = puVar9[-1];
          uVar1 = puVar9[-2];
          puVar9 = puVar9 + -1;
        }
        *puVar9 = uVar2;
        puVar10 = puVar10 + 1;
      } while (puVar10 != __last);
    }
  }
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }